

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O0

void __thiscall SceneRender::renderDevLook(SceneRender *this,Uniforms *_uniforms)

{
  size_type sVar1;
  reference ppMVar2;
  Vbo *pVVar3;
  Shader *pSVar4;
  ulong local_28;
  size_t i_1;
  size_t i;
  Uniforms *_uniforms_local;
  SceneRender *this_local;
  
  for (i_1 = 0; sVar1 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::size
                                  (&this->m_devlook_spheres), i_1 < sVar1; i_1 = i_1 + 1) {
    ppMVar2 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::operator[]
                        (&this->m_devlook_spheres,i_1);
    pVVar3 = vera::Model::getVbo(*ppMVar2);
    if (pVVar3 != (Vbo *)0x0) {
      ppMVar2 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::operator[]
                          (&this->m_devlook_spheres,i_1);
      pSVar4 = vera::Model::getShader(*ppMVar2);
      vera::Shader::use(pSVar4);
      ppMVar2 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::operator[]
                          (&this->m_devlook_spheres,i_1);
      pSVar4 = vera::Model::getShader(*ppMVar2);
      (*(_uniforms->super_Scene)._vptr_Scene[0x3e])(_uniforms,pSVar4,1);
      ppMVar2 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::operator[]
                          (&this->m_devlook_spheres,i_1);
      vera::Model::render(*ppMVar2);
    }
  }
  for (local_28 = 0;
      sVar1 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::size
                        (&this->m_devlook_billboards), local_28 < sVar1; local_28 = local_28 + 1) {
    ppMVar2 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::operator[]
                        (&this->m_devlook_billboards,local_28);
    pVVar3 = vera::Model::getVbo(*ppMVar2);
    if (pVVar3 != (Vbo *)0x0) {
      ppMVar2 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::operator[]
                          (&this->m_devlook_billboards,local_28);
      pSVar4 = vera::Model::getShader(*ppMVar2);
      vera::Shader::use(pSVar4);
      ppMVar2 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::operator[]
                          (&this->m_devlook_billboards,local_28);
      pSVar4 = vera::Model::getShader(*ppMVar2);
      (*(_uniforms->super_Scene)._vptr_Scene[0x3e])(_uniforms,pSVar4,1);
      ppMVar2 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::operator[]
                          (&this->m_devlook_billboards,local_28);
      vera::Model::render(*ppMVar2);
    }
  }
  return;
}

Assistant:

void SceneRender::renderDevLook(Uniforms& _uniforms) {
    for (size_t i = 0; i < m_devlook_spheres.size(); i++) {
        if (m_devlook_spheres[i]->getVbo() == nullptr)
            continue;

        m_devlook_spheres[i]->getShader()->use();
        _uniforms.feedTo( m_devlook_spheres[i]->getShader() );
        m_devlook_spheres[i]->render();
    }

    for (size_t i = 0; i < m_devlook_billboards.size(); i++) {
        if (m_devlook_billboards[i]->getVbo() == nullptr)
            continue;

        m_devlook_billboards[i]->getShader()->use();
        _uniforms.feedTo( m_devlook_billboards[i]->getShader() );
        m_devlook_billboards[i]->render();
    }
}